

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PropertyIdOnRegSlotsContainer * Js::PropertyIdOnRegSlotsContainer::New(Recycler *recycler)

{
  Recycler *alloc;
  PropertyIdOnRegSlotsContainer *this;
  TrackAllocData local_38;
  Recycler *local_10;
  Recycler *recycler_local;
  
  local_10 = recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x15f4);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_38);
  this = (PropertyIdOnRegSlotsContainer *)new<Memory::Recycler>(0x18,alloc,0x43c4b0);
  PropertyIdOnRegSlotsContainer(this);
  return this;
}

Assistant:

PropertyIdOnRegSlotsContainer * PropertyIdOnRegSlotsContainer::New(Recycler * recycler)
    {
        return RecyclerNew(recycler, PropertyIdOnRegSlotsContainer);
    }